

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

float ImGui::SliderCalcRatioFromValueT<long_long,double>
                (ImGuiDataType data_type,longlong v,longlong v_min,longlong v_max,float power,
                float linear_zero_pos)

{
  longlong lVar1;
  longlong lVar2;
  float fVar3;
  long local_58;
  bool local_4a;
  float f_1;
  float f;
  longlong v_clamped;
  bool is_power;
  float linear_zero_pos_local;
  float power_local;
  longlong v_max_local;
  longlong v_min_local;
  longlong v_local;
  ImGuiDataType data_type_local;
  
  if (v_min == v_max) {
    v_local._4_4_ = 0.0;
  }
  else {
    local_4a = false;
    if ((power != 1.0) || (NAN(power))) {
      local_4a = data_type == 8 || data_type == 9;
    }
    if (v_min < v_max) {
      local_58 = ImClamp<long_long>(v,v_min,v_max);
    }
    else {
      local_58 = ImClamp<long_long>(v,v_max,v_min);
    }
    if (local_4a) {
      if (0.0 <= (float)local_58) {
        lVar1 = ImMax<long_long>(0,v_min);
        lVar2 = ImMax<long_long>(0,v_min);
        fVar3 = ImPow((float)((local_58 - lVar1) / (v_max - lVar2)),1.0 / power);
        v_local._4_4_ = fVar3 * (1.0 - linear_zero_pos) + linear_zero_pos;
      }
      else {
        lVar1 = ImMin<long_long>(0,v_max);
        fVar3 = ImPow(1.0 - (float)((local_58 - v_min) / (lVar1 - v_min)),1.0 / power);
        v_local._4_4_ = (1.0 - fVar3) * linear_zero_pos;
      }
    }
    else {
      v_local._4_4_ = (float)((double)(local_58 - v_min) / (double)(v_max - v_min));
    }
  }
  return v_local._4_4_;
}

Assistant:

float ImGui::SliderCalcRatioFromValueT(ImGuiDataType data_type, TYPE v, TYPE v_min, TYPE v_max, float power, float linear_zero_pos)
{
    if (v_min == v_max)
        return 0.0f;

    const bool is_power = (power != 1.0f) && (data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double);
    const TYPE v_clamped = (v_min < v_max) ? ImClamp(v, v_min, v_max) : ImClamp(v, v_max, v_min);
    if (is_power)
    {
        if (v_clamped < 0.0f)
        {
            const float f = 1.0f - (float)((v_clamped - v_min) / (ImMin((TYPE)0, v_max) - v_min));
            return (1.0f - ImPow(f, 1.0f/power)) * linear_zero_pos;
        }
        else
        {
            const float f = (float)((v_clamped - ImMax((TYPE)0, v_min)) / (v_max - ImMax((TYPE)0, v_min)));
            return linear_zero_pos + ImPow(f, 1.0f/power) * (1.0f - linear_zero_pos);
        }
    }

    // Linear slider
    return (float)((FLOATTYPE)(v_clamped - v_min) / (FLOATTYPE)(v_max - v_min));
}